

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_bigfloat
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,string_type *str,
          error_code *ec)

{
  byte *pbVar1;
  byte *pbVar2;
  pointer puVar3;
  uint8_t *puVar4;
  byte bVar5;
  ushort uVar6;
  uint64_t uVar7;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  byte *pbVar8;
  cbor_errc __e;
  char cVar9;
  uint8_t b;
  bigint n;
  byte local_b1;
  uint64_t local_b0;
  basic_bigint<std::allocator<unsigned_char>_> local_a8;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  uVar7 = get_uint64_value(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (uVar7 == 2) {
    pbVar1 = (this->source_).current_;
    uVar6 = 0x100;
    if (pbVar1 < (this->source_).end_) {
      uVar6 = (ushort)*pbVar1;
    }
    if (uVar6 < 0x100) {
      bVar5 = (byte)uVar6 >> 5;
      if (bVar5 == 1) {
        uVar7 = get_int64_value(this,ec);
      }
      else {
        if (bVar5 != 0) goto LAB_0025e5aa;
        uVar7 = get_uint64_value(this,ec);
      }
      if (ec->_M_value != 0) {
        return;
      }
      pbVar1 = (this->source_).current_;
      pbVar2 = (this->source_).end_;
      uVar6 = 0x100;
      if (pbVar1 < pbVar2) {
        uVar6 = (ushort)*pbVar1;
      }
      if (uVar6 < 0x100) {
        bVar5 = (byte)uVar6 >> 5;
        if (bVar5 != 6) {
          if (bVar5 == 1) {
            get_int64_value(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
LAB_0025e5db:
            basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
            return;
          }
          if (bVar5 == 0) {
            get_uint64_value(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
            goto LAB_0025e5db;
          }
          goto LAB_0025e5aa;
        }
        local_b0 = uVar7;
        memcpy(&local_b1,pbVar1,(ulong)(pbVar2 != pbVar1));
        pbVar8 = pbVar1 + (pbVar2 != pbVar1);
        (this->source_).current_ = pbVar8;
        if (pbVar2 != pbVar1) {
          uVar6 = 0x100;
          if (pbVar8 < pbVar2) {
            uVar6 = (ushort)*pbVar8;
          }
          if (uVar6 < 0x100) {
            if ((uVar6 & 0xe0) != 0x40) goto LAB_0025e5db;
            puVar3 = (this->bytes_buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((this->bytes_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar3) {
              (this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar3;
            }
            read_byte_string(this,&this->bytes_buffer_,ec);
            if (ec->_M_value == 0) {
              cVar9 = (char)str;
              if ((local_b1 & 0x1f) == 3) {
                std::__cxx11::string::push_back(cVar9);
                std::__cxx11::string::push_back(cVar9);
                puVar4 = (this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                          (&local_a8,1,puVar4,
                           (long)(this->bytes_buffer_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
                local_58.field_0._0_1_ = local_58.field_0._0_1_ & 0xfc | 2;
                local_58.field_0.common_stor_.length_ = 1;
                local_58.field_0.short_stor_.values_[0] = 1;
                local_58.field_0.short_stor_.values_[1] = 0;
                n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_58,&local_a8)
                ;
                basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_80,n_00);
                basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a8,&local_80);
                if (((local_80.field_0._0_1_ & 1) != 0) &&
                   ((pointer)local_80.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                  operator_delete(local_80.field_0.dynamic_stor_.data_,
                                  local_80.field_0.short_stor_.values_[0] << 3);
                }
                if (((local_58.field_0._0_1_ & 1) != 0) &&
                   ((pointer)local_58.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                  operator_delete(local_58.field_0.dynamic_stor_.data_,
                                  local_58.field_0.short_stor_.values_[0] << 3);
                }
                basic_bigint<std::allocator<unsigned_char>>::
                write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,str);
                basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
              }
              else if ((local_b1 & 0x1f) == 2) {
                std::__cxx11::string::push_back(cVar9);
                std::__cxx11::string::push_back(cVar9);
                puVar4 = (this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                          (&local_a8,1,puVar4,
                           (long)(this->bytes_buffer_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
                basic_bigint<std::allocator<unsigned_char>>::
                write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,str);
                basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat
                          ((basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *)
                           &local_a8);
              }
              goto LAB_0025e5db;
            }
            goto LAB_0025e5b7;
          }
        }
      }
    }
    __e = unexpected_eof;
  }
  else {
LAB_0025e5aa:
    __e = invalid_bigfloat;
  }
  std::error_code::operator=(ec,__e);
LAB_0025e5b7:
  this->more_ = false;
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }